

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyze.cpp
# Opt level: O3

int __thiscall CaDiCaL::Internal::find_conflict_level(Internal *this,int *forced)

{
  pointer *ppWVar1;
  vector<CaDiCaL::Watch,_std::allocator<CaDiCaL::Watch>_> *pvVar2;
  uint uVar3;
  uint uVar4;
  Clause *pCVar5;
  pointer pVVar6;
  Clause *pCVar7;
  iterator __position;
  uint uVar8;
  uint uVar9;
  bool bVar10;
  bool bVar11;
  uint uVar12;
  pointer pWVar13;
  long lVar14;
  long lVar15;
  pointer pWVar16;
  ulong uVar17;
  pointer pWVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  uint uVar23;
  ulong uVar24;
  bool bVar25;
  Watch local_50;
  int *local_40;
  long local_38;
  
  *forced = 0;
  pCVar5 = this->conflict;
  iVar19 = pCVar5->size;
  if ((long)iVar19 == 0) {
    uVar12 = 0;
    iVar22 = 0;
    bVar25 = false;
  }
  else {
    pVVar6 = (this->vtab).super__Vector_base<CaDiCaL::Var,_std::allocator<CaDiCaL::Var>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar14 = 0;
    iVar22 = 0;
    iVar20 = 0;
    do {
      uVar12 = *(uint *)((long)&pCVar5[1].field_0 + lVar14);
      uVar3 = -uVar12;
      if (0 < (int)uVar12) {
        uVar3 = uVar12;
      }
      iVar21 = pVVar6[uVar3].level;
      if (iVar22 < iVar21) {
        *forced = uVar12;
        iVar22 = iVar21;
        iVar20 = 1;
      }
      else if ((iVar21 == iVar22) &&
              (iVar21 = iVar20 + 1, bVar25 = 0 < iVar20, iVar20 = iVar21,
              bVar25 && iVar22 == this->level)) break;
      lVar14 = lVar14 + 4;
      iVar21 = iVar20;
    } while ((long)iVar19 * 4 != lVar14);
    uVar12 = pCVar5->size;
    bVar25 = iVar21 == 1;
  }
  local_38 = (long)(int)uVar12 + -1;
  bVar10 = true;
  lVar14 = 0;
  uVar24 = 0;
  local_40 = forced;
  do {
    uVar3 = *(uint *)((long)&pCVar5[1].field_0 + uVar24 * 4);
    uVar8 = -uVar3;
    if (0 < (int)uVar3) {
      uVar8 = uVar3;
    }
    uVar17 = uVar24;
    uVar23 = uVar3;
    if ((long)uVar24 < local_38) {
      pVVar6 = (this->vtab).super__Vector_base<CaDiCaL::Var,_std::allocator<CaDiCaL::Var>_>._M_impl.
               super__Vector_impl_data._M_start;
      iVar19 = pVVar6[uVar8].level;
      lVar15 = lVar14;
      do {
        uVar4 = *(uint *)((long)&pCVar5[1].field_0 + lVar15 * 4 + 4);
        uVar9 = -uVar4;
        if (0 < (int)uVar4) {
          uVar9 = uVar4;
        }
        iVar20 = pVVar6[uVar9].level;
        if (iVar19 < iVar20) {
          uVar23 = uVar4;
          if (iVar20 == iVar22) {
            uVar17 = (ulong)((int)lVar15 + 1);
            break;
          }
          uVar17 = lVar15 + 1;
          iVar19 = iVar20;
        }
        lVar15 = lVar15 + 1;
      } while ((ulong)uVar12 - 1 != lVar15);
    }
    if (uVar24 != (uVar17 & 0xffffffff)) {
      if ((int)uVar17 < 2) {
        *(uint *)((long)&pCVar5[1].field_0 + (long)(int)uVar17 * 4) = uVar3;
        *(uint *)((long)&pCVar5[1].field_0 + uVar24 * 4) = uVar23;
      }
      else {
        pvVar2 = (this->wtab).
                 super__Vector_base<std::vector<CaDiCaL::Watch,_std::allocator<CaDiCaL::Watch>_>,_std::allocator<std::vector<CaDiCaL::Watch,_std::allocator<CaDiCaL::Watch>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + (uVar8 << 1 | uVar3 >> 0x1f);
        pWVar16 = (pvVar2->super__Vector_base<CaDiCaL::Watch,_std::allocator<CaDiCaL::Watch>_>).
                  _M_impl.super__Vector_impl_data._M_start;
        pWVar13 = (pvVar2->super__Vector_base<CaDiCaL::Watch,_std::allocator<CaDiCaL::Watch>_>).
                  _M_impl.super__Vector_impl_data._M_finish;
        pWVar18 = pWVar13;
        if (pWVar16 != pWVar13) {
          pCVar7 = this->conflict;
          pWVar18 = pWVar16;
          do {
            iVar19 = pWVar16->blit;
            iVar20 = pWVar16->size;
            pWVar18->clause = pWVar16->clause;
            pWVar18->blit = iVar19;
            pWVar18->size = iVar20;
            pWVar18 = pWVar18 + (pWVar18->clause != pCVar7);
            pWVar16 = pWVar16 + 1;
          } while (pWVar16 != pWVar13);
          pWVar13 = (pvVar2->super__Vector_base<CaDiCaL::Watch,_std::allocator<CaDiCaL::Watch>_>).
                    _M_impl.super__Vector_impl_data._M_start;
        }
        std::vector<CaDiCaL::Watch,_std::allocator<CaDiCaL::Watch>_>::resize
                  (pvVar2,(long)pWVar18 - (long)pWVar13 >> 4);
        *(uint *)((long)&pCVar5[1].field_0 + (uVar17 & 0xffffffff) * 4) = uVar3;
        *(uint *)((long)&pCVar5[1].field_0 + uVar24 * 4) = uVar23;
        local_50.blit = *(int *)((long)&pCVar5[1].field_0 + (uVar24 ^ 1) * 4);
        uVar3 = -uVar23;
        if (0 < (int)uVar23) {
          uVar3 = uVar23;
        }
        local_50.clause = this->conflict;
        pvVar2 = (this->wtab).
                 super__Vector_base<std::vector<CaDiCaL::Watch,_std::allocator<CaDiCaL::Watch>_>,_std::allocator<std::vector<CaDiCaL::Watch,_std::allocator<CaDiCaL::Watch>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + (uVar3 << 1 | uVar23 >> 0x1f);
        local_50.size = (local_50.clause)->size;
        __position._M_current =
             (pvVar2->super__Vector_base<CaDiCaL::Watch,_std::allocator<CaDiCaL::Watch>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (pvVar2->super__Vector_base<CaDiCaL::Watch,_std::allocator<CaDiCaL::Watch>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<CaDiCaL::Watch,_std::allocator<CaDiCaL::Watch>_>::
          _M_realloc_insert<CaDiCaL::Watch>(pvVar2,__position,&local_50);
        }
        else {
          (__position._M_current)->clause = local_50.clause;
          (__position._M_current)->blit = local_50.blit;
          (__position._M_current)->size = local_50.size;
          ppWVar1 = &(pvVar2->super__Vector_base<CaDiCaL::Watch,_std::allocator<CaDiCaL::Watch>_>).
                     _M_impl.super__Vector_impl_data._M_finish;
          *ppWVar1 = *ppWVar1 + 1;
        }
      }
    }
    lVar14 = lVar14 + 1;
    uVar24 = 1;
    bVar11 = !bVar10;
    bVar10 = false;
    if (bVar11) {
      if (!bVar25) {
        *local_40 = 0;
      }
      return iVar22;
    }
  } while( true );
}

Assistant:

inline int Internal::find_conflict_level (int &forced) {

  assert (conflict);
  assert (opts.chrono || opts.otfs || external_prop);

  int res = 0, count = 0;

  forced = 0;

  for (const auto &lit : *conflict) {
    const int tmp = var (lit).level;
    if (tmp > res) {
      res = tmp;
      forced = lit;
      count = 1;
    } else if (tmp == res) {
      count++;
      if (res == level && count > 1)
        break;
    }
  }

  LOG ("%d literals on actual conflict level %d", count, res);

  const int size = conflict->size;
  int *lits = conflict->literals;

  // Move the two highest level literals to the front.
  //
  for (int i = 0; i < 2; i++) {

    const int lit = lits[i];

    int highest_position = i;
    int highest_literal = lit;
    int highest_level = var (highest_literal).level;

    for (int j = i + 1; j < size; j++) {
      const int other = lits[j];
      const int tmp = var (other).level;
      if (highest_level >= tmp)
        continue;
      highest_literal = other;
      highest_position = j;
      highest_level = tmp;
      if (highest_level == res)
        break;
    }

    // No unwatched higher assignment level literal.
    //
    if (highest_position == i)
      continue;

    if (highest_position > 1) {
      LOG (conflict, "unwatch %d in", lit);
      remove_watch (watches (lit), conflict);
    }

    lits[highest_position] = lit;
    lits[i] = highest_literal;

    if (highest_position > 1)
      watch_literal (highest_literal, lits[!i], conflict);
  }

  // Only if the number of highest level literals in the conflict is one
  // then we can reuse the conflict clause as driving clause for 'forced'.
  //
  if (count != 1)
    forced = 0;

  return res;
}